

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLiSample * __thiscall
pbrt::GoniometricLight::SampleLi
          (LightLiSample *__return_storage_ptr__,GoniometricLight *this,LightSampleContext ctx,
          Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Transform *this_00;
  undefined8 uVar1;
  Point3fi *pPVar2;
  float a;
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar10 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  float fVar11;
  undefined1 auVar14 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar16 [16];
  Point3<float> PVar17;
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  Tuple3<pbrt::Point3,_float> local_b0;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Tuple3<pbrt::Point3,_float> local_90;
  undefined1 local_80 [8];
  Interval<float> IStack_78;
  Interval<float> IStack_70;
  Float FStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Tuple3<pbrt::Normal3,_float> aTStack_58 [2];
  MediumInterface *local_40;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_38;
  undefined1 auVar15 [56];
  
  this_00 = &(this->super_LightBase).renderFromLight;
  IStack_78.high = local_80._4_4_;
  _local_80 = (Tuple3<pbrt::Point3,_float>)ZEXT812(0);
  PVar17 = Transform::operator()(this_00,(Point3<float> *)local_80);
  auVar4._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = in_register_00001208;
  local_90._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_90.z = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  PVar18 = LightSampleContext::p(&ctx);
  auVar5._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = in_register_00001208;
  auVar3 = vsubps_avx(auVar4._0_16_,auVar5._0_16_);
  auVar10 = ZEXT856(auVar3._8_8_);
  auVar14 = (undefined1  [60])0x0;
  uVar1 = vmovlps_avx(auVar3);
  IStack_78.low =
       PVar17.super_Tuple3<pbrt::Point3,_float>.z - PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  local_80._0_4_ = (int)uVar1;
  local_80._4_4_ = (int)((ulong)uVar1 >> 0x20);
  VVar19 = Normalize<float>((Vector3<float> *)local_80);
  fVar11 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15 = auVar14._4_56_;
  auVar6._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  auVar16._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
  auVar16._8_4_ = auVar10._0_4_ ^ 0x80000000;
  auVar16._12_4_ = auVar10._4_4_ ^ 0x80000000;
  local_a0.z = -fVar11;
  auVar3._0_8_ = CONCAT44(auVar14._0_4_,fVar11) ^ 0x8000000080000000;
  auVar3._8_4_ = auVar14._4_4_ ^ 0x80000000;
  auVar3._12_4_ = auVar14._8_4_ ^ 0x80000000;
  auVar10 = ZEXT856(auVar3._8_8_);
  local_a0._0_8_ = vmovlps_avx(auVar16);
  VVar19 = Transform::ApplyInverse<float>(this_00,(Vector3<float> *)&local_a0);
  SVar20 = Scale(this,(Vector3f)VVar19.super_Tuple3<pbrt::Vector3,_float>,&lambda);
  auVar12._0_8_ = SVar20.values.values._8_8_;
  auVar12._8_56_ = auVar15;
  auVar7._0_8_ = SVar20.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  _local_80 = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar12._0_16_);
  auVar10 = ZEXT856(local_80._8_8_);
  PVar18 = LightSampleContext::p(&ctx);
  local_b0.z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  local_b0._0_8_ = vmovlps_avx(auVar8._0_16_);
  a = DistanceSquared<float>((Point3<float> *)&local_90,(Point3<float> *)&local_b0);
  auVar10 = extraout_var;
  SVar20 = SampledSpectrum::operator/((SampledSpectrum *)local_80,a);
  auVar13._0_8_ = SVar20.values.values._8_8_;
  auVar13._8_56_ = auVar15;
  auVar9._0_8_ = SVar20.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  Interaction::Interaction
            ((Interaction *)local_80,(Point3f *)&local_90,0.0,
             &(this->super_LightBase).mediumInterface);
  auVar3 = vunpcklpd_avx(auVar9._0_16_,auVar13._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar3;
  uVar1 = vmovlps_avx(auVar6._0_16_);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
  __return_storage_ptr__->pdf = 1.0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (ulong)this | 0x4000000000000;
  (__return_storage_ptr__->pLight).mediumInterface = local_40;
  pPVar2 = &(__return_storage_ptr__->pLight).pi;
  (pPVar2->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = (float)local_80._0_4_;
  (pPVar2->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = (float)local_80._4_4_;
  (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_78;
  (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_70;
  (__return_storage_ptr__->pLight).time = FStack_68;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_64;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_60;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_5c;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x = aTStack_58[0].x;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = aTStack_58[0].y;
  *(undefined8 *)&(__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z =
       aTStack_58._8_8_;
  *(undefined8 *)&(__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y =
       aTStack_58[1]._4_8_;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_38.bits;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample GoniometricLight::SampleLi(LightSampleContext ctx, Point2f u,
                                         SampledWavelengths lambda,
                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        Scale(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(this, L, wi, 1, Interaction(p, 0 /* time */, &mediumInterface));
}